

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::TestResult::Skipped(TestResult *this)

{
  bool bVar1;
  int iVar2;
  bool local_11;
  TestResult *this_local;
  
  bVar1 = Failed(this);
  local_11 = false;
  if (!bVar1) {
    iVar2 = internal::
            CountIf<std::vector<testing::TestPartResult,std::allocator<testing::TestPartResult>>,bool(*)(testing::TestPartResult_const&)>
                      (&this->test_part_results_,TestPartSkipped);
    local_11 = 0 < iVar2;
  }
  return local_11;
}

Assistant:

bool TestResult::Skipped() const {
  return !Failed() && CountIf(test_part_results_, TestPartSkipped) > 0;
}